

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::emitSphere(SemanticParser *this,SP *shape)

{
  undefined8 uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  element_type *peVar9;
  element_type *peVar10;
  char *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SP *in_RSI;
  element_type *in_RDI;
  float fVar11;
  SP SVar12;
  SP ours;
  shared_ptr<pbrt::Sphere> *in_stack_fffffffffffffef8;
  shared_ptr<pbrt::syntactic::Material> *in_stack_ffffffffffffff00;
  shared_ptr<pbrt::Shape> *this_00;
  shared_ptr<pbrt::Material> *in_stack_ffffffffffffff28;
  allocator<char> *__a;
  element_type *this_01;
  SemanticParser *this_02;
  allocator<char> local_79;
  string local_78 [20];
  float in_stack_ffffffffffffff9c;
  string *in_stack_ffffffffffffffa0;
  ParamSet *in_stack_ffffffffffffffa8;
  undefined1 local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffc0;
  element_type *in_stack_ffffffffffffffc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffd0;
  
  this_01 = in_RDI;
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a19ab);
  this_02 = (SemanticParser *)local_48;
  std::shared_ptr<pbrt::syntactic::Material>::shared_ptr
            (in_stack_ffffffffffffff00,
             (shared_ptr<pbrt::syntactic::Material> *)in_stack_fffffffffffffef8);
  findOrCreateMaterial(this_02,in_RSI);
  std::make_shared<pbrt::Sphere,std::shared_ptr<pbrt::Material>>(in_stack_ffffffffffffff28);
  std::shared_ptr<pbrt::Material>::~shared_ptr((shared_ptr<pbrt::Material> *)0x1a1a01);
  std::shared_ptr<pbrt::syntactic::Material>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Material> *)0x1a1a0e);
  peVar9 = std::
           __shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a1a18);
  peVar10 = std::__shared_ptr_access<pbrt::Sphere,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pbrt::Sphere,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a1a2a);
  fVar7 = (peVar9->transform).atStart.l.vx.x;
  fVar8 = (peVar9->transform).atStart.l.vx.y;
  uVar1 = *(undefined8 *)&(peVar9->transform).atStart.l.vx.z;
  fVar3 = (peVar9->transform).atStart.l.vy.y;
  fVar4 = (peVar9->transform).atStart.l.vy.z;
  fVar5 = (peVar9->transform).atStart.l.vz.x;
  fVar6 = (peVar9->transform).atStart.l.vz.y;
  fVar11 = (peVar9->transform).atStart.p.y;
  fVar2 = (peVar9->transform).atStart.p.z;
  *(undefined8 *)&(peVar10->transform).l.vz.z = *(undefined8 *)&(peVar9->transform).atStart.l.vz.z;
  (peVar10->transform).p.y = fVar11;
  (peVar10->transform).p.z = fVar2;
  (peVar10->transform).l.vy.y = fVar3;
  (peVar10->transform).l.vy.z = fVar4;
  (peVar10->transform).l.vz.x = fVar5;
  (peVar10->transform).l.vz.y = fVar6;
  (peVar10->transform).l.vx.x = fVar7;
  (peVar10->transform).l.vx.y = fVar8;
  *(undefined8 *)&(peVar10->transform).l.vx.z = uVar1;
  std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1a1a5d);
  __a = &local_79;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,in_RDX,__a
            );
  fVar11 = syntactic::ParamSet::getParam1f
                     (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c)
  ;
  this_00 = (shared_ptr<pbrt::Shape> *)&stack0xffffffffffffffd8;
  peVar10 = std::__shared_ptr_access<pbrt::Sphere,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<pbrt::Sphere,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1a1ac2);
  peVar10->radius = fVar11;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::shared_ptr<pbrt::Shape>::shared_ptr<pbrt::Sphere,void>(this_00,in_stack_fffffffffffffef8);
  std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)this_00,
             (shared_ptr<pbrt::syntactic::Shape> *)in_stack_fffffffffffffef8);
  extractTextures((SemanticParser *)in_stack_ffffffffffffffd0._M_pi,(SP *)in_stack_ffffffffffffffc8,
                  (SP *)in_stack_ffffffffffffffc0._M_pi);
  std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Shape> *)0x1a1b32);
  std::shared_ptr<pbrt::Shape>::~shared_ptr((shared_ptr<pbrt::Shape> *)0x1a1b3c);
  std::shared_ptr<pbrt::Shape>::shared_ptr<pbrt::Sphere,void>(this_00,in_stack_fffffffffffffef8);
  std::shared_ptr<pbrt::Sphere>::~shared_ptr((shared_ptr<pbrt::Sphere> *)0x1a1b5b);
  SVar12.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  SVar12.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar12.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::emitSphere(pbrt::syntactic::Shape::SP shape)
  {
    Sphere::SP ours = std::make_shared<Sphere>(findOrCreateMaterial(shape->material));

    ours->transform = shape->transform.atStart;
    ours->radius    = shape->getParam1f("radius");
    extractTextures(ours,shape);
      
    return ours;
  }